

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

VariablePatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VariablePatternSyntax,slang::syntax::VariablePatternSyntax_const&>
          (BumpAllocator *this,VariablePatternSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  VariablePatternSyntax *pVVar13;
  
  pVVar13 = (VariablePatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariablePatternSyntax *)this->endPtr < pVVar13 + 1) {
    pVVar13 = (VariablePatternSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pVVar13 + 1);
  }
  (pVVar13->variableName).info = (args->variableName).info;
  SVar11 = (args->super_PatternSyntax).super_SyntaxNode.kind;
  uVar12 = *(undefined4 *)&(args->super_PatternSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PatternSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PatternSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->dot).kind;
  uVar8 = (args->dot).field_0x2;
  NVar9.raw = (args->dot).numFlags.raw;
  uVar10 = (args->dot).rawLen;
  TVar3 = (args->variableName).kind;
  uVar4 = (args->variableName).field_0x2;
  NVar5.raw = (args->variableName).numFlags.raw;
  uVar6 = (args->variableName).rawLen;
  (pVVar13->dot).info = (args->dot).info;
  (pVVar13->variableName).kind = TVar3;
  (pVVar13->variableName).field_0x2 = uVar4;
  (pVVar13->variableName).numFlags = (NumericTokenFlags)NVar5.raw;
  (pVVar13->variableName).rawLen = uVar6;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pVVar13->dot).kind = TVar7;
  (pVVar13->dot).field_0x2 = uVar8;
  (pVVar13->dot).numFlags = (NumericTokenFlags)NVar9.raw;
  (pVVar13->dot).rawLen = uVar10;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.kind = SVar11;
  *(undefined4 *)&(pVVar13->super_PatternSyntax).super_SyntaxNode.field_0x4 = uVar12;
  (pVVar13->super_PatternSyntax).super_SyntaxNode.parent = pSVar1;
  return pVVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }